

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstantExecution.h
# Opt level: O1

void nrg::InstantExecution::push<TimedCaller>(Queue *queue,TimedCaller *fn)

{
  pointer pcVar1;
  QueueElement elem;
  _Any_data _Stack_88;
  code *local_78;
  _Any_data local_68;
  code *local_58;
  long *local_48 [2];
  long local_38 [2];
  rep local_28;
  
  pcVar1 = (fn->msg_)._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + (fn->msg_)._M_string_length);
  local_28 = (fn->started_).__d.__r;
  std::function<void()>::
  function<nrg::InstantExecution::push<TimedCaller>(std::queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>&,TimedCaller)::_lambda()_1_,void>
            ((function<void()> *)local_68._M_pod_data,(anon_class_40_1_3fcf6586 *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  std::function<void_()>::function((function<void_()> *)&_Stack_88,(function<void_()> *)&local_68);
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)queue,
             (function<void_()> *)&_Stack_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&_Stack_88,&_Stack_88,__destroy_functor);
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = [=]() { fn(param...); };
        push(queue, elem);
    }